

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

Index __thiscall
wasm::OptimizeInstructions::getSignExtBits(OptimizeInstructions *this,Expression *curr)

{
  Id IVar1;
  bool bVar2;
  Index IVar3;
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> in_RCX;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
  local_108;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
  local_c8;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_88;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_60;
  undefined8 local_50;
  undefined4 local_48;
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_40;
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_28;
  Expression *extended;
  int32_t leftShift;
  int32_t rightShift;
  
  if ((curr->type).id == 2) {
    IVar1 = curr->_id;
    if (IVar1 == UnaryId) {
      if (*(int *)(curr + 1) - 0x2fU < 2) {
        in_RCX = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>)curr[1].type.id;
      }
      else {
        in_RCX = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>)0x0;
      }
    }
    if (IVar1 == UnaryId) goto LAB_009e41c6;
    local_108.submatchers.curr.submatchers.curr.binder =
         (matched_t<wasm::Match::Internal::AnyKind<int>_> *)&extended;
    extended._0_4_ = 0;
    local_c8.submatchers.curr.submatchers.curr.binder =
         (matched_t<wasm::Match::Internal::AnyKind<int>_> *)((long)&extended + 4);
    extended._4_4_ = 0;
    local_60.binder = &local_28;
    local_28 = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>)0x0;
    local_88.submatchers.curr = &local_60;
    local_88.submatchers.next.curr = &local_108;
    local_108.submatchers.curr.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
    local_108.binder = (matched_t<wasm::Const_*> *)0x0;
    local_40.curr = &local_88;
    local_88.binder =
         (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> *)0x0;
    local_88.data = ShlInt32;
    local_40.next.curr = &local_c8;
    local_c8.submatchers.curr.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
    local_c8.binder = (matched_t<wasm::Const_*> *)0x0;
    local_50 = 0;
    local_48 = 0xb;
    if ((((IVar1 == BinaryId) && (*(int *)(curr + 1) == 0xb)) &&
        (bVar2 = Match::Internal::
                 Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
                 ::match((matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>
                          )curr,&local_40), bVar2)) &&
       (((int)extended == extended._4_4_ && (in_RCX = local_28, (int)extended != 0))))
    goto LAB_009e41c6;
  }
  in_RCX = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>)0x0;
LAB_009e41c6:
  if (in_RCX == (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>)0x0) {
    IVar3 = 0;
    if (curr->_id == LocalGetId) {
      IVar3 = (this->localInfo).
              super__Vector_base<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_>._M_impl.
              super__Vector_impl_data._M_start[*(uint *)(curr + 1)].signExtBits;
    }
  }
  else {
    IVar3 = Properties::getSignExtBits(curr);
  }
  return IVar3;
}

Assistant:

Index getSignExtBits(Expression* curr) {
    if (Properties::getSignExtValue(curr)) {
      return Properties::getSignExtBits(curr);
    }
    if (auto* get = curr->dynCast<LocalGet>()) {
      // Check what we know about the local.
      return localInfo[get->index].signExtBits;
    }
    return 0;
  }